

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b_think.cpp
# Opt level: O2

void __thiscall DBot::Set_enemy(DBot *this)

{
  TObjPtr<AActor> *obj;
  APlayerPawn *pAVar1;
  bool bVar2;
  AActor *pAVar3;
  AActor *pAVar4;
  
  obj = &this->enemy;
  pAVar3 = GC::ReadBarrier<AActor>((AActor **)obj);
  if ((pAVar3 == (AActor *)0x0) ||
     (pAVar3 = GC::ReadBarrier<AActor>((AActor **)obj), pAVar3->health < 1)) {
    pAVar3 = (AActor *)0x0;
  }
  else {
    pAVar1 = this->player->mo;
    pAVar4 = GC::ReadBarrier<AActor>((AActor **)obj);
    pAVar3 = (AActor *)0x0;
    bVar2 = P_CheckSight(&pAVar1->super_AActor,pAVar4,0);
    if (bVar2) {
      pAVar3 = GC::ReadBarrier<AActor>((AActor **)obj);
    }
  }
  if ((deathmatch.Value != 0) ||
     (pAVar4 = GC::ReadBarrier<AActor>((AActor **)obj), pAVar4 == (AActor *)0x0)) {
    pAVar4 = GC::ReadBarrier<AActor>((AActor **)obj);
    this->allround = pAVar4 != (AActor *)0x0;
    pAVar4 = Find_enemy(this);
    (this->enemy).field_0.p = pAVar4;
    pAVar4 = GC::ReadBarrier<AActor>((AActor **)obj);
    if (pAVar4 == (AActor *)0x0) {
      (obj->field_0).p = pAVar3;
    }
  }
  pAVar3 = GC::ReadBarrier<AActor>((AActor **)obj);
  if (pAVar3 != (AActor *)0x0) {
    pAVar3 = GC::ReadBarrier<AActor>((AActor **)obj);
    if ((-1 < pAVar3->health) &&
       (pAVar3 = GC::ReadBarrier<AActor>((AActor **)obj), ((pAVar3->flags).Value & 4) != 0)) {
      pAVar1 = this->player->mo;
      pAVar3 = GC::ReadBarrier<AActor>((AActor **)obj);
      bVar2 = AActor::IsFriend(&pAVar1->super_AActor,pAVar3);
      if (!bVar2) {
        return;
      }
    }
    (obj->field_0).p = (AActor *)0x0;
  }
  return;
}

Assistant:

void DBot::Set_enemy ()
{
	AActor *oldenemy;

	if (enemy
		&& enemy->health > 0
		&& P_CheckSight (player->mo, enemy))
	{
		oldenemy = enemy;
	}
	else
	{
		oldenemy = NULL;
	}

	// [RH] Don't even bother looking for a different enemy if this is not deathmatch
	// and we already have an existing enemy.
	if (deathmatch || !enemy)
	{
		allround = !!enemy;
		enemy = Find_enemy();
		if (!enemy)
			enemy = oldenemy; //Try go for last (it will be NULL if there wasn't anyone)
	}
	//Verify that that enemy is really something alive that bot can kill.
	if (enemy && ((enemy->health < 0 || !(enemy->flags&MF_SHOOTABLE)) || player->mo->IsFriend(enemy)))
		enemy = NULL;
}